

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineHuge.cpp
# Opt level: O0

void testDeepScanLineHuge(string *tempDir)

{
  ostream *poVar1;
  exception *e;
  string fn;
  string *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffaf;
  undefined8 in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\n\nTesting the DeepScanLineInput/OutputFile for huge scanlines:\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  random_reseed(0);
  std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  anon_unknown.dwarf_c305a::readWriteTest
            ((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0,
             (bool)in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa0);
  anon_unknown.dwarf_c305a::readWriteTest
            ((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0,
             (bool)in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa0);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void
testDeepScanLineHuge (const std::string& tempDir)
{
    try
    {
        cout
            << "\n\nTesting the DeepScanLineInput/OutputFile for huge scanlines:\n"
            << endl;

        random_reseed (1);
        std::string fn = tempDir + "imf_test_deep_scanline_huge.exr";

        readWriteTest (10, 5, false, fn);
        readWriteTest (10, 5, true, fn);
        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}